

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

array * __thiscall mpt::array::operator=(array *this,array *a)

{
  long lVar1;
  content *pcVar2;
  content *pcVar3;
  
  pcVar3 = (a->_buf)._ref;
  pcVar2 = (this->_buf)._ref;
  if (pcVar3 != pcVar2) {
    if (pcVar3 == (content *)0x0) {
      pcVar3 = (content *)0x0;
    }
    else {
      lVar1 = (**(code **)(*(long *)pcVar3 + 0x10))(pcVar3);
      if (lVar1 == 0) {
        pcVar3 = (content *)0x0;
      }
      pcVar2 = (this->_buf)._ref;
    }
    if (pcVar2 != (content *)0x0) {
      (**(code **)(*(long *)pcVar2 + 8))();
    }
    (this->_buf)._ref = pcVar3;
  }
  return this;
}

Assistant:

array &array::operator= (const array &a)
{
	_buf = a._buf;
	return *this;
}